

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exchange_dt.h
# Opt level: O0

void __thiscall AllReduce::kernel(AllReduce *this,int param_2,int param_3)

{
  long in_RDI;
  double dVar1;
  int coords [3];
  int local_1c [7];
  
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x10);
  dVar1 = Packer::pack((Packer *)(in_RDI + 0x48),*(int *)(in_RDI + 0x18),*(int *)(in_RDI + 0x1c),
                       *(int *)(in_RDI + 0x20));
  *(int *)(in_RDI + 0x30) = (int)dVar1;
  MPI_Allreduce(in_RDI + 0x28,in_RDI + 0x38,1,&ompi_mpi_double_int,&ompi_mpi_op_minloc,
                &ompi_mpi_comm_world);
  Packer::unpack((Packer *)(in_RDI + 0x48),(double)*(int *)(in_RDI + 0x40),local_1c);
  return;
}

Assistant:

inline void kernel(int, int) override
    {
        sbuf.dt = dt;
        // See the comments in the constructor.
        sbuf.index = (int)packer.pack(x, y, z);

        MPI_Allreduce(&sbuf, &rbuf, 1, MPI_DOUBLE_INT, MPI_MINLOC, MPI_COMM_WORLD);

        int coords[3];
        packer.unpack(rbuf.index, coords);
#ifdef DEBUG_MODE
        std::cout << "rank " << rank << " min dt " << rbuf.dt << " at "
                  << coords[0] << ", " << coords[1] << ", " << coords[2] << "\n";
#endif
    }